

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enc_sse2.c
# Opt level: O2

void FTransformPass1_SSE2(__m128i *in01,__m128i *in23,__m128i *out01,__m128i *out32)

{
  short sVar1;
  short sVar2;
  short sVar3;
  short sVar4;
  short sVar5;
  short sVar6;
  short sVar7;
  short sVar8;
  undefined1 auVar9 [12];
  undefined1 auVar10 [16];
  undefined4 uVar13;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar14 [12];
  undefined1 auVar19 [16];
  
  sVar1 = (short)(*in01)[0];
  sVar2 = *(short *)((long)*in01 + 2);
  sVar3 = *(short *)((long)*in01 + 4);
  sVar4 = *(short *)((long)*in01 + 6);
  sVar5 = (short)(*in23)[0];
  sVar6 = *(short *)((long)*in23 + 2);
  sVar7 = *(short *)((long)*in23 + 4);
  sVar8 = *(short *)((long)*in23 + 6);
  auVar18._2_2_ = (short)(*in23)[1];
  auVar18._0_2_ = (short)(*in01)[1];
  auVar18._4_2_ = *(undefined2 *)((long)*in01 + 10);
  auVar18._6_2_ = *(undefined2 *)((long)*in23 + 10);
  auVar18._8_2_ = *(undefined2 *)((long)*in01 + 0xc);
  auVar18._10_2_ = *(undefined2 *)((long)*in23 + 0xc);
  auVar18._12_2_ = *(undefined2 *)((long)*in01 + 0xe);
  auVar18._14_2_ = *(undefined2 *)((long)*in23 + 0xe);
  auVar15 = pshuflw(auVar18,auVar18,0xd8);
  auVar15 = pshufhw(auVar15,auVar15,0x27);
  auVar16._0_4_ = auVar15._0_4_;
  auVar16._8_4_ = auVar15._8_4_;
  auVar16._4_4_ = auVar15._12_4_;
  auVar16._12_4_ = auVar15._4_4_;
  auVar15 = pshuflw(auVar16,auVar16,0xe1);
  auVar17 = pshufhw(auVar15,auVar15,0x4b);
  auVar20._0_2_ = sVar1 + auVar17._0_2_;
  auVar20._2_2_ = sVar2 + auVar17._2_2_;
  auVar20._4_2_ = sVar3 + auVar17._4_2_;
  auVar20._6_2_ = sVar4 + auVar17._6_2_;
  auVar20._8_2_ = sVar5 + auVar17._8_2_;
  auVar20._10_2_ = sVar6 + auVar17._10_2_;
  auVar20._12_2_ = sVar7 + auVar17._12_2_;
  auVar20._14_2_ = sVar8 + auVar17._14_2_;
  auVar15._0_2_ = sVar1 - auVar17._0_2_;
  auVar15._2_2_ = sVar2 - auVar17._2_2_;
  auVar15._4_2_ = sVar3 - auVar17._4_2_;
  auVar15._6_2_ = sVar4 - auVar17._6_2_;
  auVar15._8_2_ = sVar5 - auVar17._8_2_;
  auVar15._10_2_ = sVar6 - auVar17._10_2_;
  auVar15._12_2_ = sVar7 - auVar17._12_2_;
  auVar15._14_2_ = sVar8 - auVar17._14_2_;
  auVar17 = pmaddwd(_DAT_001abbc0,auVar20);
  auVar21 = pmaddwd(auVar20,_DAT_001abbd0);
  auVar18 = packssdw(auVar17,auVar21);
  auVar17 = pmaddwd(_DAT_001abbe0,auVar15);
  auVar15 = pmaddwd(auVar15,_DAT_001abbf0);
  auVar22._0_4_ = auVar17._0_4_ + 0x714 >> 9;
  auVar22._4_4_ = auVar17._4_4_ + 0x714 >> 9;
  auVar22._8_4_ = auVar17._8_4_ + 0x714 >> 9;
  auVar22._12_4_ = auVar17._12_4_ + 0x714 >> 9;
  auVar17._0_4_ = auVar15._0_4_ + 0x3a9 >> 9;
  auVar17._4_4_ = auVar15._4_4_ + 0x3a9 >> 9;
  auVar17._8_4_ = auVar15._8_4_ + 0x3a9 >> 9;
  auVar17._12_4_ = auVar15._12_4_ + 0x3a9 >> 9;
  auVar15 = packssdw(auVar22,auVar17);
  auVar12._0_12_ = auVar18._0_12_;
  auVar12._12_2_ = auVar18._6_2_;
  auVar12._14_2_ = auVar15._6_2_;
  auVar11._12_4_ = auVar12._12_4_;
  auVar11._0_10_ = auVar18._0_10_;
  auVar11._10_2_ = auVar15._4_2_;
  auVar10._10_6_ = auVar11._10_6_;
  auVar10._0_8_ = auVar18._0_8_;
  auVar10._8_2_ = auVar18._4_2_;
  auVar9._4_8_ = auVar10._8_8_;
  auVar9._2_2_ = auVar15._2_2_;
  auVar9._0_2_ = auVar18._2_2_;
  auVar21._0_4_ = CONCAT22(auVar15._0_2_,auVar18._0_2_);
  auVar21._4_12_ = auVar9;
  uVar13 = CONCAT22(auVar15._8_2_,auVar18._8_2_);
  auVar14._0_8_ = CONCAT26(auVar15._10_2_,CONCAT24(auVar18._10_2_,uVar13));
  auVar14._8_2_ = auVar18._12_2_;
  auVar14._10_2_ = auVar15._12_2_;
  auVar19._12_2_ = auVar18._14_2_;
  auVar19._0_12_ = auVar14;
  auVar19._14_2_ = auVar15._14_2_;
  auVar23._0_8_ = auVar21._0_8_;
  auVar23._8_4_ = auVar9._0_4_;
  auVar23._12_4_ = (int)((ulong)auVar14._0_8_ >> 0x20);
  (*out01)[0] = CONCAT44(uVar13,auVar21._0_4_);
  (*out01)[1] = auVar23._8_8_;
  *(undefined4 *)*out32 = auVar11._12_4_;
  *(int *)((long)*out32 + 4) = auVar19._12_4_;
  *(int *)(*out32 + 1) = auVar10._8_4_;
  *(int *)((long)*out32 + 0xc) = auVar14._8_4_;
  return;
}

Assistant:

static void FTransformPass1_SSE2(const __m128i* const in01,
                                 const __m128i* const in23,
                                 __m128i* const out01,
                                 __m128i* const out32) {
  const __m128i k937 = _mm_set1_epi32(937);
  const __m128i k1812 = _mm_set1_epi32(1812);

  const __m128i k88p = _mm_set_epi16(8, 8, 8, 8, 8, 8, 8, 8);
  const __m128i k88m = _mm_set_epi16(-8, 8, -8, 8, -8, 8, -8, 8);
  const __m128i k5352_2217p = _mm_set_epi16(2217, 5352, 2217, 5352,
                                            2217, 5352, 2217, 5352);
  const __m128i k5352_2217m = _mm_set_epi16(-5352, 2217, -5352, 2217,
                                            -5352, 2217, -5352, 2217);

  // *in01 = 00 01 10 11 02 03 12 13
  // *in23 = 20 21 30 31 22 23 32 33
  const __m128i shuf01_p = _mm_shufflehi_epi16(*in01, _MM_SHUFFLE(2, 3, 0, 1));
  const __m128i shuf23_p = _mm_shufflehi_epi16(*in23, _MM_SHUFFLE(2, 3, 0, 1));
  // 00 01 10 11 03 02 13 12
  // 20 21 30 31 23 22 33 32
  const __m128i s01 = _mm_unpacklo_epi64(shuf01_p, shuf23_p);
  const __m128i s32 = _mm_unpackhi_epi64(shuf01_p, shuf23_p);
  // 00 01 10 11 20 21 30 31
  // 03 02 13 12 23 22 33 32
  const __m128i a01 = _mm_add_epi16(s01, s32);
  const __m128i a32 = _mm_sub_epi16(s01, s32);
  // [d0 + d3 | d1 + d2 | ...] = [a0 a1 | a0' a1' | ... ]
  // [d0 - d3 | d1 - d2 | ...] = [a3 a2 | a3' a2' | ... ]

  const __m128i tmp0   = _mm_madd_epi16(a01, k88p);  // [ (a0 + a1) << 3, ... ]
  const __m128i tmp2   = _mm_madd_epi16(a01, k88m);  // [ (a0 - a1) << 3, ... ]
  const __m128i tmp1_1 = _mm_madd_epi16(a32, k5352_2217p);
  const __m128i tmp3_1 = _mm_madd_epi16(a32, k5352_2217m);
  const __m128i tmp1_2 = _mm_add_epi32(tmp1_1, k1812);
  const __m128i tmp3_2 = _mm_add_epi32(tmp3_1, k937);
  const __m128i tmp1   = _mm_srai_epi32(tmp1_2, 9);
  const __m128i tmp3   = _mm_srai_epi32(tmp3_2, 9);
  const __m128i s03    = _mm_packs_epi32(tmp0, tmp2);
  const __m128i s12    = _mm_packs_epi32(tmp1, tmp3);
  const __m128i s_lo   = _mm_unpacklo_epi16(s03, s12);   // 0 1 0 1 0 1...
  const __m128i s_hi   = _mm_unpackhi_epi16(s03, s12);   // 2 3 2 3 2 3
  const __m128i v23    = _mm_unpackhi_epi32(s_lo, s_hi);
  *out01 = _mm_unpacklo_epi32(s_lo, s_hi);
  *out32 = _mm_shuffle_epi32(v23, _MM_SHUFFLE(1, 0, 3, 2));  // 3 2 3 2 3 2..
}